

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::CappedArray<char,5ul>>(char *target,CappedArray<char,_5UL> *first)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = first->currentSize;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    target[sVar2] = first->content[sVar2];
  }
  return target + sVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}